

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O3

void quicksort<server::crcinfo,bool(*)(server::crcinfo_const&,server::crcinfo_const&)>
               (crcinfo *start,crcinfo *end,_func_bool_crcinfo_ptr_crcinfo_ptr *fun)

{
  bool bVar1;
  ulong uVar2;
  crcinfo cVar3;
  crcinfo *pcVar4;
  crcinfo *pcVar5;
  crcinfo *pcVar6;
  crcinfo pivot;
  crcinfo local_50;
  crcinfo *local_48;
  crcinfo *local_40;
  crcinfo *local_38;
  
  uVar2 = (long)end - (long)start >> 3;
  if (10 < (long)uVar2) {
    do {
      pcVar5 = (crcinfo *)(&start->crc + (uVar2 & 0xfffffffffffffffe));
      local_38 = end;
      bVar1 = (*fun)(start,pcVar5);
      pcVar6 = end + -1;
      local_48 = end;
      if (bVar1) {
        bVar1 = (*fun)(pcVar6,start);
        if (bVar1) {
          local_50 = *start;
          *start = *pcVar6;
        }
        else {
          bVar1 = (*fun)(pcVar6,pcVar5);
          if (!bVar1) {
            local_50 = *pcVar5;
            goto LAB_00145427;
          }
          local_50 = *pcVar6;
        }
        cVar3 = *pcVar5;
LAB_00145424:
        *pcVar6 = cVar3;
      }
      else {
        bVar1 = (*fun)(start,pcVar6);
        if (!bVar1) {
          bVar1 = (*fun)(pcVar5,pcVar6);
          if (bVar1) {
            local_50 = *pcVar6;
            *pcVar6 = *start;
            goto LAB_001453fb;
          }
          local_50 = *pcVar5;
          cVar3 = *start;
          *start = *pcVar6;
          goto LAB_00145424;
        }
        local_50 = *start;
LAB_001453fb:
        *start = *pcVar5;
      }
LAB_00145427:
      pcVar4 = local_48 + -2;
      *pcVar5 = *pcVar4;
      pcVar5 = start + 1;
      local_40 = start;
      pcVar6 = pcVar4;
      do {
        while (end = pcVar5, bVar1 = (*fun)(end,&local_50), !bVar1) {
          while( true ) {
            pcVar6 = pcVar6 + -1;
            bVar1 = (*fun)(&local_50,pcVar6);
            if (!bVar1) break;
            if (pcVar6 <= end) goto LAB_00145498;
          }
          cVar3 = *end;
          *end = *pcVar6;
          *pcVar6 = cVar3;
          pcVar5 = end + 1;
          if (pcVar6 <= end + 1) {
            end = end + 1;
            goto LAB_00145498;
          }
        }
        end = end + 1;
        pcVar5 = end;
      } while (end < pcVar6);
LAB_00145498:
      *pcVar4 = *end;
      *end = local_50;
      pcVar5 = end + 1;
      if ((long)end - (long)start < (long)local_38 - (long)pcVar5) {
        quicksort<server::crcinfo,bool(*)(server::crcinfo_const&,server::crcinfo_const&)>
                  (local_40,end,fun);
        end = local_48;
        start = pcVar5;
      }
      else {
        quicksort<server::crcinfo,bool(*)(server::crcinfo_const&,server::crcinfo_const&)>
                  (pcVar5,local_48,fun);
        start = local_40;
      }
      uVar2 = (long)end - (long)start >> 3;
    } while (10 < (long)uVar2);
  }
  if (start + 1 < end) {
    pcVar6 = start + 1;
    pcVar5 = start;
    local_48 = end;
    do {
      pcVar4 = pcVar6;
      bVar1 = (*fun)(pcVar4,pcVar5);
      if (bVar1) {
        local_50 = pcVar5[1];
        pcVar5[1] = *pcVar5;
        while (start < pcVar5) {
          bVar1 = (*fun)(&local_50,pcVar5 + -1);
          if (!bVar1) break;
          *pcVar5 = pcVar5[-1];
          pcVar5 = pcVar5 + -1;
        }
        *pcVar5 = local_50;
      }
      pcVar6 = pcVar4 + 1;
      pcVar5 = pcVar4;
    } while (pcVar4 + 1 < local_48);
  }
  return;
}

Assistant:

static inline void quicksort(T *start, T *end, F fun)
{
    while(end-start > 10)
    {
        T *mid = &start[(end-start)/2], *i = start+1, *j = end-2, pivot;
        if(fun(*start, *mid)) /* start < mid */
        {
            if(fun(end[-1], *start)) { pivot = *start; *start = end[-1]; end[-1] = *mid; } /* end < start < mid */
            else if(fun(end[-1], *mid)) { pivot = end[-1]; end[-1] = *mid; } /* start <= end < mid */
            else { pivot = *mid; } /* start < mid <= end */
        }
        else if(fun(*start, end[-1])) { pivot = *start; *start = *mid; } /*mid <= start < end */
        else if(fun(*mid, end[-1])) { pivot = end[-1]; end[-1] = *start; *start = *mid; } /* mid < end <= start */
        else { pivot = *mid; swap(*start, end[-1]); }  /* end <= mid <= start */
        *mid = end[-2];
        do
        {
            while(fun(*i, pivot)) if(++i >= j) goto partitioned;
            while(fun(pivot, *--j)) if(i >= j) goto partitioned;
            swap(*i, *j);
        }
        while(++i < j);
    partitioned:
        end[-2] = *i;
        *i = pivot;
        
        if(i-start < end-(i+1))
        {
            quicksort(start, i, fun);
            start = i+1;
        }
        else
        {
            quicksort(i+1, end, fun);
            end = i;
        }
    }
    
    insertionsort(start, end, fun);
}